

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teaminfo.cpp
# Opt level: O0

void __thiscall FTeam::ParseTeamDefinition(FTeam *this,FScanner *Scan)

{
  bool bVar1;
  int iVar2;
  int local_54;
  undefined1 local_50 [4];
  int valid;
  FTeam Team;
  FScanner *Scan_local;
  FTeam *this_local;
  
  Team._48_8_ = Scan;
  FTeam((FTeam *)local_50);
  local_54 = -1;
  FScanner::MustGetString((FScanner *)Team._48_8_);
  FString::operator=((FString *)&Team.m_iPresent,*(char **)Team._48_8_);
  FScanner::MustGetStringName((FScanner *)Team._48_8_,"{");
  while (bVar1 = FScanner::CheckString((FScanner *)Team._48_8_,"}"), ((bVar1 ^ 0xffU) & 1) != 0) {
    FScanner::MustGetString((FScanner *)Team._48_8_);
    iVar2 = FScanner::MatchString((FScanner *)Team._48_8_,TeamInfoOptions,8);
    switch(iVar2) {
    case 0:
      FScanner::MustGetString((FScanner *)Team._48_8_);
      bVar1 = FScanner::Compare((FScanner *)Team._48_8_,"Any");
      if (bVar1) {
        local_54 = 1;
      }
      else {
        bVar1 = CheckGame(*(char **)Team._48_8_,false);
        if (bVar1) {
          local_54 = 1;
        }
        else if (local_54 == -1) {
          local_54 = 0;
        }
      }
      break;
    case 1:
      FScanner::MustGetString((FScanner *)Team._48_8_);
      Team.m_Name.Chars._0_4_ = V_GetColor((DWORD *)0x0,*(char **)Team._48_8_);
      break;
    case 2:
      FScanner::MustGetString((FScanner *)Team._48_8_);
      FString::AppendFormat((FString *)&Team.m_iPlayerColor,"[%s]",*(undefined8 *)Team._48_8_);
      break;
    case 3:
      FScanner::MustGetString((FScanner *)Team._48_8_);
      FString::operator=(&Team.m_TextColor,*(char **)Team._48_8_);
      break;
    case 4:
      Team.m_Logo.Chars._0_1_ = 1;
      break;
    case 5:
    case 6:
    case 7:
    case 9:
    case 10:
    case 0xb:
    case 0xc:
    case 0xd:
    case 0xe:
    case 0xf:
    case 0x10:
      FScanner::MustGetString((FScanner *)Team._48_8_);
      break;
    case 8:
      FScanner::MustGetNumber((FScanner *)Team._48_8_);
      break;
    default:
      FScanner::ScriptError
                ((FScanner *)Team._48_8_,"ParseTeamDefinition: Unknown team option \'%s\'.\n",
                 *(undefined8 *)Team._48_8_);
    }
  }
  if (local_54 != 0) {
    TArray<FTeam,_FTeam>::Push(&Teams,(FTeam *)local_50);
  }
  ~FTeam((FTeam *)local_50);
  return;
}

Assistant:

void FTeam::ParseTeamDefinition (FScanner &Scan)
{
	FTeam Team;
	int valid = -1;
	Scan.MustGetString ();
	Team.m_Name = Scan.String;
	Scan.MustGetStringName ("{");

	while (!Scan.CheckString ("}"))
	{
		Scan.MustGetString ();

		switch (Scan.MatchString (TeamInfoOptions))
		{
		case TEAMINFO_Game:
			Scan.MustGetString ();
			if (Scan.Compare("Any")) valid = 1;
			else if (CheckGame(Scan.String, false)) valid = 1;
			else if (valid == -1) valid = 0;
			break;

		case TEAMINFO_PlayerColor:
			Scan.MustGetString ();
			Team.m_iPlayerColor = V_GetColor (NULL, Scan.String);
			break;

		case TEAMINFO_TextColor:
			Scan.MustGetString ();
			Team.m_TextColor.AppendFormat ("[%s]", Scan.String);
			break;

		case TEAMINFO_Logo:
			Scan.MustGetString ();
			Team.m_Logo = Scan.String;
			break;

		case TEAMINFO_AllowCustomPlayerColor:
			Team.m_bAllowCustomPlayerColor = true;
			break;

		case TEAMINFO_PlayerStartThingNumber:
			Scan.MustGetNumber ();
			break;

		case TEAMINFO_RailColor:
		case TEAMINFO_FlagItem:
		case TEAMINFO_SkullItem:
		case TEAMINFO_SmallFlagHUDIcon:
		case TEAMINFO_SmallSkullHUDIcon:
		case TEAMINFO_LargeFlagHUDIcon:
		case TEAMINFO_LargeSkullHUDIcon:
		case TEAMINFO_WinnerPic:
		case TEAMINFO_LoserPic:
		case TEAMINFO_WinnerTheme:
		case TEAMINFO_LoserTheme:
			Scan.MustGetString ();
			break;

		default:
			Scan.ScriptError ("ParseTeamDefinition: Unknown team option '%s'.\n", Scan.String);
			break;
		}
	}

	if (valid) Teams.Push (Team);
}